

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::ReservoirSample::AddToReservoir(ReservoirSample *this,DataChunk *chunk)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_01;
  ulong uVar1;
  idx_t iVar2;
  SamplingState SVar3;
  idx_t iVar4;
  pointer pBVar5;
  pointer pDVar6;
  Allocator *allocator;
  type pDVar7;
  pointer pRVar8;
  DataChunk *this_;
  ulong uVar9;
  idx_t count;
  templated_unique_single_t slice;
  SelectionVectorHelper chunk_sel;
  SelectionVector input_sel;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> uStack_68;
  SelectionVectorHelper local_60;
  SelectionVector local_40;
  
  if (((this->super_BlockingSample).destroyed == false) && (chunk->count != 0)) {
    if ((this->reservoir_chunk).
        super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
        .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl ==
        (ReservoirChunk *)0x0) {
      uVar1 = this->sample_count;
      uVar9 = 0x800;
      if (uVar1 < 0x800) {
        uVar9 = uVar1;
      }
      if (uVar9 * 10 + uVar1 == 0) {
        return;
      }
    }
    iVar4 = FillReservoir(this,chunk);
    this_00 = &(this->super_BlockingSample).base_reservoir_sample;
    pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
    if (iVar4 != chunk->count) {
      if (iVar4 == 0) {
        this_01 = &this->reservoir_chunk;
        pRVar8 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->(this_01);
        GetReplacementIndexes(&local_60,this,(pRVar8->chunk).count,chunk->count);
        if ((ulong)local_60.size == 0) {
          iVar4 = chunk->count;
          pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                   ::operator->(this_00);
          pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
        }
        else {
          this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   ::operator->(this_01)->chunk;
          UpdateSampleAppend(this,this_,chunk,&local_60.sel,(ulong)local_60.size);
          iVar4 = chunk->count;
          pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                   ::operator->(this_00);
          pBVar5->num_entries_seen_total = pBVar5->num_entries_seen_total + iVar4;
          SVar3 = GetSamplingState(this);
          if ((SVar3 == RANDOM) && (iVar4 = GetTuplesSeen(this), 0x1dfff < iVar4)) {
            ConvertToReservoirSample(this);
          }
          pRVar8 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   ::operator->(this_01);
          uVar1 = this->sample_count;
          uVar9 = 0x800;
          if (uVar1 < 0x800) {
            uVar9 = uVar1;
          }
          if ((long)(uVar1 + uVar9 * 10 + -0x1800) <= (long)(pRVar8->chunk).count) {
            Vacuum(this);
          }
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.sel.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        make_uniq<duckdb::DataChunk>();
        iVar2 = chunk->count;
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_60,chunk);
        count = iVar2 - iVar4;
        SelectionVector::SelectionVector(&local_40,count);
        for (; iVar2 != iVar4; iVar4 = iVar4 + 1) {
          *local_40.sel_vector = (sel_t)iVar4;
          local_40.sel_vector = local_40.sel_vector + 1;
        }
        pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&uStack_68);
        allocator = Allocator::DefaultAllocator();
        DataChunk::Initialize(pDVar6,allocator,(vector<duckdb::LogicalType,_true> *)&local_60,count)
        ;
        pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&uStack_68);
        DataChunk::Slice(pDVar6,chunk,&local_40,count,0);
        pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&uStack_68);
        pDVar6->count = count;
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&uStack_68);
        (*(this->super_BlockingSample)._vptr_BlockingSample[2])(this,pDVar7);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60);
        ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                  (&uStack_68);
      }
    }
  }
  return;
}

Assistant:

void ReservoirSample::AddToReservoir(DataChunk &chunk) {
	if (destroyed || chunk.size() == 0) {
		return;
	}

	if (!reservoir_chunk && GetReservoirChunkCapacity<idx_t>() == 0) {
		return;
	}
	idx_t tuples_consumed = FillReservoir(chunk);
	base_reservoir_sample->num_entries_seen_total += tuples_consumed;
	D_ASSERT(sample_count == 0 || reservoir_chunk->chunk.size() >= 1);

	if (tuples_consumed == chunk.size()) {
		return;
	}

	// the chunk filled the first FIXED_SAMPLE_SIZE chunk but still has tuples remaining
	// slice the chunk and call AddToReservoir again.
	if (tuples_consumed != chunk.size() && tuples_consumed != 0) {
		// Fill reservoir consumed some of the chunk to reach FIXED_SAMPLE_SIZE
		// now we need to
		// So we slice it and call AddToReservoir
		auto slice = make_uniq<DataChunk>();
		auto samples_remaining = chunk.size() - tuples_consumed;
		auto types = chunk.GetTypes();
		SelectionVector input_sel(samples_remaining);
		for (idx_t i = 0; i < samples_remaining; i++) {
			input_sel.set_index(i, tuples_consumed + i);
		}
		slice->Initialize(Allocator::DefaultAllocator(), types, samples_remaining);
		slice->Slice(chunk, input_sel, samples_remaining);
		slice->SetCardinality(samples_remaining);
		AddToReservoir(*slice);
		return;
	}

	// at this point we should have collected at least sample count samples
	D_ASSERT(GetActiveSampleCount() >= sample_count);

	auto chunk_sel = GetReplacementIndexes(reservoir_chunk->chunk.size(), chunk.size());

	if (chunk_sel.size == 0) {
		// not adding any samples
		base_reservoir_sample->num_entries_seen_total += chunk.size();
		return;
	}

	idx_t size = chunk_sel.size;
	D_ASSERT(size <= chunk.size());
	D_ASSERT(reservoir_chunk->chunk.size() < GetReservoirChunkCapacity<idx_t>());

	UpdateSampleAppend(reservoir_chunk->chunk, chunk, chunk_sel.sel, size);

	base_reservoir_sample->num_entries_seen_total += chunk.size();
	D_ASSERT(base_reservoir_sample->reservoir_weights.size() == 0 ||
	         base_reservoir_sample->reservoir_weights.size() == sample_count);

	Verify();

	// if we are over the threshold, we ned to switch to slow sampling.
	if (GetSamplingState() == SamplingState::RANDOM && GetTuplesSeen() >= FIXED_SAMPLE_SIZE * FAST_TO_SLOW_THRESHOLD) {
		ConvertToReservoirSample();
	}
	if (static_cast<int64_t>(reservoir_chunk->chunk.size()) >=
	    GetReservoirChunkCapacity<int64_t>() - (static_cast<int64_t>(FIXED_SAMPLE_SIZE) * 3)) {
		Vacuum();
	}
}